

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAssignmentOperator(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == AddAssignmentExpression) || (kind == AndAssignmentExpression)) ||
       (kind - ArithmeticLeftShiftAssignmentExpression < 2)) ||
      (((kind == AssignmentExpression || (kind == DivideAssignmentExpression)) ||
       ((kind == LogicalLeftShiftAssignmentExpression ||
        ((kind == LogicalRightShiftAssignmentExpression || (kind == ModAssignmentExpression))))))))
     || ((kind == MultiplyAssignmentExpression ||
         ((((kind == NonblockingAssignmentExpression || (kind == OrAssignmentExpression)) ||
           (kind == SubtractAssignmentExpression)) || (kind == XorAssignmentExpression)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAssignmentOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
            return true;
        default:
            return false;
    }
}